

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void write_rbsp_slice_trailing_bits(h264_stream_t *h,bs_t *b)

{
  byte *pbVar1;
  int i;
  int iVar2;
  int iVar3;
  
  write_rbsp_trailing_bits(b);
  if ((h->pps->entropy_coding_mode_flag != 0) && (b->p < b->end)) {
    iVar2 = 0;
    do {
      iVar3 = b->bits_left + -1;
      b->bits_left = iVar3;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
      }
      if (b->bits_left == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
      }
      iVar2 = iVar2 + 1;
    } while ((iVar2 != 0x10) || (iVar2 = 0, b->p < b->end));
  }
  return;
}

Assistant:

void write_rbsp_slice_trailing_bits(h264_stream_t* h, bs_t* b)
{
    write_rbsp_trailing_bits(b);
    if( h->pps->entropy_coding_mode_flag )
    {
        while( more_rbsp_trailing_data(h, b) )
        {
            /* cabac_zero_word */ bs_write_u(b, 16, 0x0000);
        }
    }
}